

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

void __thiscall rcg::Device::enableModuleEvents(Device *this)

{
  GC_ERROR GVar1;
  element_type *peVar2;
  undefined8 uVar3;
  long in_RDI;
  lock_guard<std::mutex> lock;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_000005b0;
  string *in_stack_000005b8;
  GenTLException *in_stack_000005c0;
  mutex_type *in_stack_ffffffffffffff98;
  lock_guard<std::mutex> *in_stack_ffffffffffffffa0;
  allocator *paVar4;
  allocator local_41;
  string local_40 [64];
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if ((*(long *)(in_RDI + 0x80) != 0) && (*(long *)(in_RDI + 0x90) == 0)) {
    peVar2 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x116f55);
    GVar1 = (*peVar2->GCRegisterEvent)
                      (*(EVENTSRC_HANDLE *)(in_RDI + 0x80),5,(EVENT_HANDLE *)(in_RDI + 0x90));
    if (GVar1 != 0) {
      uVar3 = __cxa_allocate_exception(0x28);
      paVar4 = &local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"Device::enableModuleEvents()",paVar4);
      GenTLException::GenTLException(in_stack_000005c0,in_stack_000005b8,in_stack_000005b0);
      __cxa_throw(uVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x117059);
  return;
}

Assistant:

void Device::enableModuleEvents()
{
  std::lock_guard<std::mutex> lock(mtx);

  if (dev && !event)
  {
    if (gentl->GCRegisterEvent(dev, GenTL::EVENT_MODULE, &event) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("Device::enableModuleEvents()", gentl);
    }
  }
}